

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5PrepareStatement(sqlite3_stmt **ppStmt,Fts5Config *pConfig,char *zFmt,...)

{
  char in_AL;
  int iVar1;
  char *zSql;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  sqlite3_stmt *pRet;
  undefined1 local_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  sqlite3_stmt *local_50;
  __va_list_tag local_48;
  long local_28;
  
  local_48.reg_save_area = local_108;
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Da;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = (sqlite3_stmt *)0x0;
  local_48.gp_offset = 0x18;
  local_48.fp_offset = 0x30;
  local_48.overflow_arg_area = &stack0x00000008;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  zSql = sqlite3_vmprintf("SELECT rowid, rank FROM %Q.%Q ORDER BY %s(\"%w\"%s%s) %s",&local_48);
  if (zSql == (char *)0x0) {
    iVar1 = 7;
  }
  else {
    iVar1 = sqlite3LockAndPrepare(pConfig->db,zSql,-1,0x81,(Vdbe *)0x0,&local_50,(char **)0x0);
    if (iVar1 != 0) {
      pcVar2 = sqlite3_errmsg(pConfig->db);
      sqlite3Fts5ConfigErrmsg(pConfig,"%s",pcVar2);
    }
    sqlite3_free(zSql);
  }
  *ppStmt = local_50;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5PrepareStatement(
  sqlite3_stmt **ppStmt,
  Fts5Config *pConfig,
  const char *zFmt,
  ...
){
  sqlite3_stmt *pRet = 0;
  int rc;
  char *zSql;
  va_list ap;

  va_start(ap, zFmt);
  zSql = sqlite3_vmprintf(zFmt, ap);
  if( zSql==0 ){
    rc = SQLITE_NOMEM;
  }else{
    rc = sqlite3_prepare_v3(pConfig->db, zSql, -1,
                            SQLITE_PREPARE_PERSISTENT, &pRet, 0);
    if( rc!=SQLITE_OK ){
      sqlite3Fts5ConfigErrmsg(pConfig, "%s", sqlite3_errmsg(pConfig->db));
    }
    sqlite3_free(zSql);
  }

  va_end(ap);
  *ppStmt = pRet;
  return rc;
}